

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTAudioEngine_CreateStreamingWaveBank
                   (FACTAudioEngine *pEngine,FACTStreamingParameters *pParms,
                   FACTWaveBank **ppWaveBank)

{
  uint32_t uVar1;
  uint32_t packetSize;
  uint32_t retval;
  FACTGetOverlappedResultCallback in_stack_000000c0;
  FACTReadFileCallback in_stack_000000c8;
  uint32_t in_stack_000000d0;
  uint32_t in_stack_000000d4;
  void *in_stack_000000d8;
  FACTAudioEngine *in_stack_000000e0;
  uint16_t in_stack_00000100;
  FACTWaveBank **in_stack_00000108;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x111b64);
  uVar1 = FACT_INTERNAL_ParseWaveBank
                    (in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,
                     in_stack_000000c8,in_stack_000000c0,in_stack_00000100,in_stack_00000108);
  FAudio_PlatformUnlockMutex((FAudioMutex)0x111bf8);
  return uVar1;
}

Assistant:

uint32_t FACTAudioEngine_CreateStreamingWaveBank(
	FACTAudioEngine *pEngine,
	const FACTStreamingParameters *pParms,
	FACTWaveBank **ppWaveBank
) {
	uint32_t retval, packetSize;
	FAudio_PlatformLockMutex(pEngine->apiLock);
	if (	pEngine->pReadFile == FACT_INTERNAL_DefaultReadFile &&
		pEngine->pGetOverlappedResult == FACT_INTERNAL_DefaultGetOverlappedResult	)
	{
		/* Our I/O doesn't care about packets, set to 0 as an optimization */
		packetSize = 0;
	}
	else
	{
		packetSize = pParms->packetSize * 2048;
	}
	retval = FACT_INTERNAL_ParseWaveBank(
		pEngine,
		pParms->file,
		pParms->offset,
		packetSize,
		pEngine->pReadFile,
		pEngine->pGetOverlappedResult,
		1,
		ppWaveBank
	);
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return retval;
}